

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O3

int __thiscall
raspicam::_private::Private_Impl::open(Private_Impl *this,char *__file,int __oflag,...)

{
  MMAL_PORT_T *pMVar1;
  bool bVar2;
  MMAL_COMPONENT_T *pMVar3;
  undefined7 extraout_var;
  long *plVar4;
  
  if (this->_isOpened == false) {
    pMVar3 = create_camera_component(this,&this->State);
    if (pMVar3 != (MMAL_COMPONENT_T *)0x0) {
      commitParameters(this);
      pMVar1 = ((this->State).camera_component)->output[1];
      this->camera_video_port = pMVar1;
      (this->callback_data).pstate = &this->State;
      pMVar1->userdata = (MMAL_PORT_USERDATA_T *)&this->callback_data;
      this->_isOpened = true;
      if ((char)__file == '\0') {
        return (int)CONCAT71((int7)((ulong)pMVar1 >> 8),1);
      }
      bVar2 = startCapture(this);
      return (int)CONCAT71(extraout_var,bVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"open",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," Failed to create camera component",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private/private_impl.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x66);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  return 0;
}

Assistant:

bool  Private_Impl::open ( bool StartCapture ) {
            if ( _isOpened ) return false; //already opened
// create camera
            if ( ! create_camera_component ( &State ) ) {
                cerr<<__func__<<" Failed to create camera component"<<__FILE__<<" "<<__LINE__<<endl;
                return false;
            }
            commitParameters();
            camera_video_port   = State.camera_component->output[MMAL_CAMERA_VIDEO_PORT];
            callback_data.pstate = &State;
            // assign data to use for callback
            camera_video_port->userdata = ( struct MMAL_PORT_USERDATA_T * ) &callback_data;

            _isOpened=true;
            if ( StartCapture ) return startCapture();
            else return true;
        }